

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.h
# Opt level: O0

size_type __thiscall lf::base::RefEl::NumSubEntities(RefEl *this,dim_t sub_codim)

{
  RefElType RVar1;
  dim_t dVar2;
  runtime_error *prVar3;
  dim_t sub_codim_local;
  RefEl *this_local;
  
  dVar2 = Dimension(this);
  if (dVar2 < sub_codim) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"sub_codim > Dimension()");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (sub_codim == 0) {
    this_local._4_4_ = 1;
  }
  else {
    RVar1 = this->type_;
    if (RVar1 == kSegment) {
      this_local._4_4_ = 2;
    }
    else if (RVar1 == kTria) {
      this_local._4_4_ = 3;
    }
    else {
      if (RVar1 != kQuad) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar3,"RefEl::NumSubEntities() not implemented for this RefElType.");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this_local._4_4_ = 4;
    }
  }
  return this_local._4_4_;
}

Assistant:

[[nodiscard]] constexpr size_type NumSubEntities(dim_t sub_codim) const {
    LF_ASSERT_MSG_CONSTEXPR(sub_codim >= 0, "sub_codim is negative");
    LF_ASSERT_MSG_CONSTEXPR(sub_codim <= Dimension(),
                            "sub_codim > Dimension()");
    if (sub_codim == 0) {
      return 1;
    }
    switch (type_) {
      case RefElType::kSegment:
        return 2;  // sub_codim=1
      case RefElType::kTria:
        return 3;  // sub_codim=1,2
      case RefElType::kQuad:
        return 4;  // sub_codim=1,2
      default:
        LF_ASSERT_MSG_CONSTEXPR(
            false,
            "RefEl::NumSubEntities() not implemented for this RefElType.");
    }
    return 0;  // prevent warnings from compilers
  }